

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

void avro::parsing::SimpleParser<avro::parsing::JsonHandler>::throwMismatch
               (Kind expected,Kind actual)

{
  ostream *poVar1;
  char *pcVar2;
  Exception *this;
  Kind in_ESI;
  Kind in_EDI;
  ostringstream oss;
  string *in_stack_fffffffffffffe18;
  ostringstream local_180 [376];
  Kind local_8;
  Kind local_4;
  
  local_8 = in_ESI;
  local_4 = in_EDI;
  std::__cxx11::ostringstream::ostringstream(local_180);
  poVar1 = std::operator<<((ostream *)local_180,"Invalid operation. Expected: ");
  pcVar2 = Symbol::toString(local_4);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1," got ");
  pcVar2 = Symbol::toString(local_8);
  std::operator<<(poVar1,pcVar2);
  this = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::ostringstream::str();
  Exception::Exception(this,in_stack_fffffffffffffe18);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void throwMismatch(Symbol::Kind expected, Symbol::Kind actual)
    {
        std::ostringstream oss;
        oss << "Invalid operation. Expected: " <<
            Symbol::toString(expected) << " got " <<
            Symbol::toString(actual);
        throw Exception(oss.str());
    }